

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetPropertyObject
               (Var instance,ScriptContext *scriptContext,RecyclableObject **propertyObject)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  
  if (propertyObject == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x84d,"(propertyObject)","propertyObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(instance);
    *propertyObject = pRVar5;
    uVar3 = (uint)(1 < (int)((pRVar5->type).ptr)->typeId);
  }
  else {
    *propertyObject =
         &((((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).numberPrototype.ptr)->super_RecyclableObject;
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

BOOL JavascriptOperators::GetPropertyObject(Var instance, ScriptContext * scriptContext, RecyclableObject** propertyObject)
    {
        Assert(propertyObject);
        if (TaggedNumber::Is(instance))
        {
            *propertyObject = scriptContext->GetLibrary()->GetNumberPrototype();
            return TRUE;
        }
        RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);
        *propertyObject = object;
        if (JavascriptOperators::IsUndefinedOrNull(object))
        {
            return FALSE;
        }
        return TRUE;
    }